

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O2

vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> * xmrig::OclLib::getPlatformIDs(void)

{
  cl_uint cVar1;
  vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *in_RDI;
  allocator_type local_11;
  
  cVar1 = getNumPlatforms();
  std::vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>::vector
            (in_RDI,(ulong)cVar1,&local_11);
  if (cVar1 != 0) {
    (*pGetPlatformIDs)(cVar1,(in_RDI->
                             super__Vector_base<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>
                             )._M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
  }
  return in_RDI;
}

Assistant:

std::vector<cl_platform_id> xmrig::OclLib::getPlatformIDs() noexcept
{
    const uint32_t count = getNumPlatforms();
    std::vector<cl_platform_id> platforms(count);

    if (count) {
        getPlatformIDs(count, platforms.data(), nullptr);
    }

    return platforms;
}